

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O0

void cxxopts::values::integer_parser<unsigned_short>(string *text,unsigned_short *value)

{
  char cVar1;
  bool bVar2;
  ushort uVar3;
  long lVar4;
  reference pcVar5;
  US next;
  short local_ac;
  US digit;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_a8;
  char ch;
  const_iterator __end2;
  const_iterator __begin2;
  string *__range2;
  undefined1 *puStack_88;
  US result;
  string *value_match;
  undefined1 local_78 [5];
  uint8_t base;
  bool negative;
  bool is_signed;
  IntegerDesc int_desc;
  unsigned_short *value_local;
  string *text_local;
  
  int_desc.value.field_2._8_8_ = value;
  parser_tool::SplitInteger((IntegerDesc *)local_78,text);
  value_match._7_1_ = 0;
  lVar4 = std::__cxx11::string::length();
  value_match._6_1_ = lVar4 != 0;
  lVar4 = std::__cxx11::string::length();
  value_match._5_1_ = 10;
  if (lVar4 != 0) {
    value_match._5_1_ = 0x10;
  }
  puStack_88 = (undefined1 *)((long)&int_desc.base.field_2 + 8);
  __range2._6_2_ = 0;
  __end2._M_current = (char *)std::__cxx11::string::begin();
  _Stack_a8._M_current = (char *)std::__cxx11::string::end();
  while (bVar2 = __gnu_cxx::operator!=(&__end2,&stack0xffffffffffffff58), bVar2) {
    pcVar5 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&__end2);
    cVar1 = *pcVar5;
    local_ac = 0;
    if ((cVar1 < '0') || ('9' < cVar1)) {
      if ((value_match._5_1_ == 0x10) && (('`' < cVar1 && (cVar1 < 'g')))) {
        local_ac = cVar1 + -0x57;
      }
      else if ((value_match._5_1_ == 0x10) && (('@' < cVar1 && (cVar1 < 'G')))) {
        local_ac = cVar1 + -0x37;
      }
      else {
        throw_or_mimic<cxxopts::argument_incorrect_type>(text);
      }
    }
    else {
      local_ac = cVar1 + -0x30;
    }
    uVar3 = __range2._6_2_ * value_match._5_1_ + local_ac;
    if (uVar3 < __range2._6_2_) {
      throw_or_mimic<cxxopts::argument_incorrect_type>(text);
    }
    __range2._6_2_ = uVar3;
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end2);
  }
  detail::check_signed_range<unsigned_short,unsigned_short>
            ((bool)(value_match._6_1_ & 1),__range2._6_2_,text);
  if ((value_match._6_1_ & 1) == 0) {
    *(ushort *)int_desc.value.field_2._8_8_ = __range2._6_2_;
  }
  else {
    checked_negate<unsigned_short,unsigned_short&>
              (int_desc.value.field_2._8_8_,(long)&__range2 + 6,text);
  }
  parser_tool::IntegerDesc::~IntegerDesc((IntegerDesc *)local_78);
  return;
}

Assistant:

void
    integer_parser(const std::string& text, T& value)
    {
      parser_tool::IntegerDesc int_desc = parser_tool::SplitInteger(text);

      using US = typename std::make_unsigned<T>::type;
      constexpr bool is_signed = std::numeric_limits<T>::is_signed;

      const bool          negative    = int_desc.negative.length() > 0;
      const uint8_t       base        = int_desc.base.length() > 0 ? 16 : 10;
      const std::string & value_match = int_desc.value;

      US result = 0;

      for (char ch : value_match)
      {
        US digit = 0;

        if (ch >= '0' && ch <= '9')
        {
          digit = static_cast<US>(ch - '0');
        }
        else if (base == 16 && ch >= 'a' && ch <= 'f')
        {
          digit = static_cast<US>(ch - 'a' + 10);
        }
        else if (base == 16 && ch >= 'A' && ch <= 'F')
        {
          digit = static_cast<US>(ch - 'A' + 10);
        }
        else
        {
          throw_or_mimic<argument_incorrect_type>(text);
        }

        const US next = static_cast<US>(result * base + digit);
        if (result > next)
        {
          throw_or_mimic<argument_incorrect_type>(text);
        }

        result = next;
      }

      detail::check_signed_range<T>(negative, result, text);

      if (negative)
      {
        checked_negate<T>(value, result, text, std::integral_constant<bool, is_signed>());
      }
      else
      {
        value = static_cast<T>(result);
      }
    }